

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void TrainModel(void)

{
  int *piVar1;
  longlong lVar2;
  pthread_t *__ptr;
  ulong uVar3;
  FILE *__stream;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar4;
  real *prVar5;
  FILE *__stream_00;
  long lVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  longlong lVar10;
  long lVar11;
  char *__ptr_02;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  longlong lVar15;
  ulong uVar16;
  pthread_t *__newthread;
  float fVar17;
  float fVar18;
  size_t sStack_60;
  long local_48;
  
  __ptr = (pthread_t *)malloc((long)num_threads << 3);
  if (__ptr == (pthread_t *)0x0) {
    __ptr_02 = "cannot allocate memory for threads\n";
    sStack_60 = 0x23;
  }
  else {
    printf("Starting training using file %s\n");
    starting_alpha = alpha;
    if (read_vocab_file[0] == '\0') {
      LearnVocabFromTrainFile();
    }
    else {
      ReadVocab();
    }
    if (save_vocab_file[0] != '\0') {
      SaveVocab();
    }
    if (output_file[0] == '\0') {
      return;
    }
    InitNet();
    if (0 < negative) {
      InitUnigramTable();
    }
    puts("Starting to learn");
    start = clock();
    __newthread = __ptr;
    for (pvVar8 = (void *)0x0; uVar3 = (ulong)num_threads, (long)pvVar8 < (long)uVar3;
        pvVar8 = (void *)((long)pvVar8 + 1)) {
      pthread_create(__newthread,(pthread_attr_t *)0x0,TrainModelThread,pvVar8);
      __newthread = __newthread + 1;
    }
    for (lVar9 = 0; lVar9 < (int)uVar3; lVar9 = lVar9 + 1) {
      pthread_join(__ptr[lVar9],(void **)0x0);
      uVar3 = (ulong)(uint)num_threads;
    }
    __stream = fopen(output_file,"wb");
    lVar2 = classes;
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Cannot open %s: permission denied\n",output_file);
      goto LAB_0010434e;
    }
    if (classes == 0) {
      fprintf(__stream,"%lld %lld\n",vocab_size);
      lVar6 = 0;
      for (lVar9 = 0; lVar9 < vocab_size; lVar9 = lVar9 + 1) {
        if (vocab[lVar9].word != (char *)0x0) {
          fprintf(__stream,"%s ");
        }
        if (binary == 0) {
          for (lVar7 = 0; lVar7 < layer1_size; lVar7 = lVar7 + 1) {
            fprintf(__stream,"%lf ",(double)*(float *)((long)syn0 + lVar7 * 4 + layer1_size * lVar6)
                   );
          }
        }
        else {
          lVar7 = 0;
          for (lVar11 = 0; lVar11 < layer1_size; lVar11 = lVar11 + 1) {
            fwrite((void *)((long)syn0 + lVar7 + layer1_size * lVar6),4,1,__stream);
            lVar7 = lVar7 + 4;
          }
        }
        fputc(10,__stream);
        lVar6 = lVar6 + 4;
      }
      if (hs != 0) {
        __stream_00 = fopen(output_classifier,"ab");
        lVar6 = 0;
        for (lVar9 = 0; lVar9 < vocab_size; lVar9 = lVar9 + 1) {
          if (binary == 0) {
            for (lVar7 = 0; lVar7 < layer1_size; lVar7 = lVar7 + 1) {
              fprintf(__stream_00,"%lf ",
                      (double)*(float *)((long)syn1 + lVar7 * 4 + layer1_size * lVar6));
            }
            fputc(10,__stream_00);
          }
          else {
            lVar7 = 0;
            for (lVar11 = 0; lVar11 < layer1_size; lVar11 = lVar11 + 1) {
              fwrite((void *)((long)syn1 + lVar7 + layer1_size * lVar6),4,1,__stream_00);
              lVar7 = lVar7 + 4;
            }
          }
          lVar6 = lVar6 + 4;
        }
        fclose(__stream_00);
      }
LAB_001042c9:
      fclose(__stream);
      free(table);
      free(__ptr);
      DestroyVocab();
      return;
    }
    pvVar8 = malloc(classes * 4);
    lVar10 = vocab_size;
    if (pvVar8 != (void *)0x0) {
      __ptr_00 = calloc(vocab_size,4);
      lVar15 = layer1_size;
      local_48 = 4;
      __ptr_01 = calloc(layer1_size * lVar2,4);
      uVar3 = (ulong)(int)lVar2;
      lVar6 = 0;
      lVar9 = 0;
      if (0 < lVar10) {
        lVar9 = lVar10;
      }
      for (; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        *(int *)((long)__ptr_00 + lVar6 * 4) = (int)(lVar6 % (long)uVar3);
      }
      uVar16 = 0;
      if (0 < (long)uVar3) {
        uVar16 = uVar3;
      }
      for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
        lVar6 = lVar15 * uVar3;
        if ((long)(lVar15 * uVar3) < 1) {
          lVar6 = 0;
        }
        for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
          *(undefined4 *)((long)__ptr_01 + lVar7 * 4) = 0;
        }
        for (uVar4 = 0; uVar16 != uVar4; uVar4 = uVar4 + 1) {
          *(undefined4 *)((long)pvVar8 + uVar4 * 4) = 1;
        }
        lVar6 = 0;
        if (0 < lVar15) {
          lVar6 = lVar15;
        }
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        prVar5 = syn0;
        for (lVar7 = 0; lVar7 != lVar10; lVar7 = lVar7 + 1) {
          for (lVar11 = 0; lVar6 != lVar11; lVar11 = lVar11 + 1) {
            lVar12 = (long)*(int *)((long)__ptr_00 + lVar7 * 4) * lVar15 * 4;
            *(float *)((long)__ptr_01 + lVar11 * 4 + lVar12) =
                 prVar5[lVar11] + *(float *)((long)__ptr_01 + lVar11 * 4 + lVar12);
          }
          piVar1 = (int *)((long)pvVar8 + (long)*(int *)((long)__ptr_00 + lVar7 * 4) * 4);
          *piVar1 = *piVar1 + 1;
          prVar5 = prVar5 + lVar15;
        }
        lVar6 = 0;
        for (uVar4 = 0; lVar10 = vocab_size, uVar4 != uVar16; uVar4 = uVar4 + 1) {
          lVar7 = 0;
          if (0 < lVar15) {
            lVar7 = lVar15;
          }
          fVar17 = 0.0;
          for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
            fVar18 = *(float *)((long)__ptr_01 + lVar11 * 4 + lVar15 * lVar6) /
                     (float)*(int *)((long)pvVar8 + uVar4 * 4);
            *(float *)((long)__ptr_01 + lVar11 * 4 + lVar15 * lVar6) = fVar18;
            fVar17 = fVar17 + fVar18 * fVar18;
          }
          if (fVar17 < 0.0) {
            fVar17 = sqrtf(fVar17);
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          lVar15 = layer1_size;
          lVar7 = 0;
          if (0 < layer1_size) {
            lVar7 = layer1_size;
          }
          lVar11 = layer1_size * lVar6;
          for (lVar12 = 0; lVar7 != lVar12; lVar12 = lVar12 + 1) {
            *(float *)((long)__ptr_01 + lVar12 * 4 + lVar11) =
                 *(float *)((long)__ptr_01 + lVar12 * 4 + lVar11) / fVar17;
          }
          lVar6 = lVar6 + 4;
        }
        lVar6 = 0;
        if (0 < lVar15) {
          lVar6 = lVar15;
        }
        lVar7 = 0;
        if (0 < vocab_size) {
          lVar7 = vocab_size;
        }
        prVar5 = syn0;
        for (lVar11 = 0; lVar11 != lVar7; lVar11 = lVar11 + 1) {
          uVar4 = 0;
          fVar17 = -10.0;
          pvVar14 = __ptr_01;
          for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
            fVar18 = 0.0;
            for (lVar12 = 0; lVar6 != lVar12; lVar12 = lVar12 + 1) {
              fVar18 = fVar18 + *(float *)((long)pvVar14 + lVar12 * 4) * prVar5[lVar12];
            }
            if (fVar17 < fVar18) {
              uVar4 = uVar13 & 0xffffffff;
              fVar17 = fVar18;
            }
            pvVar14 = (void *)((long)pvVar14 + lVar15 * 4);
          }
          *(int *)((long)__ptr_00 + lVar11 * 4) = (int)uVar4;
          prVar5 = prVar5 + lVar15;
        }
      }
      for (lVar9 = 0; lVar9 < lVar10; lVar9 = lVar9 + 1) {
        fprintf(__stream,"%s %d\n",*(undefined8 *)((long)&vocab->cn + local_48 * 4),
                (ulong)*(uint *)((long)__ptr_00 + lVar9 * 4));
        local_48 = local_48 + 10;
        lVar10 = vocab_size;
      }
      free(pvVar8);
      free(__ptr_01);
      free(__ptr_00);
      goto LAB_001042c9;
    }
    __ptr_02 = "cannot allocate memory for centcn\n";
    sStack_60 = 0x22;
  }
  fwrite(__ptr_02,sStack_60,1,_stderr);
LAB_0010434e:
  exit(1);
}

Assistant:

void TrainModel() {
  long a, b, c, d;
  FILE *fo;
  pthread_t *pt = (pthread_t *)malloc(num_threads * sizeof(pthread_t));
  if (pt == NULL) {
    fprintf(stderr, "cannot allocate memory for threads\n");
    exit(1);
  }
  printf("Starting training using file %s\n", train_file);
  starting_alpha = alpha;
  if (read_vocab_file[0] != 0) ReadVocab(); else LearnVocabFromTrainFile();
  if (save_vocab_file[0] != 0) SaveVocab();
  if (output_file[0] == 0) return;
  InitNet();
  if (negative > 0) InitUnigramTable();
  printf("Starting to learn\n");
  start = clock();
  for (a = 0; a < num_threads; a++) pthread_create(&pt[a], NULL, TrainModelThread, (void *)a);
  for (a = 0; a < num_threads; a++) pthread_join(pt[a], NULL);
  fo = fopen(output_file, "wb");
  if (fo == NULL) {
    fprintf(stderr, "Cannot open %s: permission denied\n", output_file);
    exit(1);
  }
  if (classes == 0) {
    // Save the word vectors
    fprintf(fo, "%lld %lld\n", vocab_size, layer1_size);
    for (a = 0; a < vocab_size; a++) {
      if (vocab[a].word != NULL) {
        fprintf(fo, "%s ", vocab[a].word);
      }
      if (binary) for (b = 0; b < layer1_size; b++) fwrite(&syn0[a * layer1_size + b], sizeof(real), 1, fo);
      else for (b = 0; b < layer1_size; b++) fprintf(fo, "%lf ", syn0[a * layer1_size + b]);
      fprintf(fo, "\n");
    }

    // Save the classifier
    if (output_classifier && hs) {
      // append to the tree that was already output
      FILE * fhs = fopen(output_classifier, "ab");
      // output the layer
      for (a = 0; a < vocab_size; a++) {
        if (binary) {
          for (b = 0; b < layer1_size; b++) fwrite(&syn1[a * layer1_size + b], sizeof(real), 1, fhs);
        } else {
          for (b = 0; b < layer1_size; b++) fprintf(fhs, "%lf ", syn1[a * layer1_size + b]);
          fprintf(fhs, "\n");
        }
      }
      fclose(fhs);
    }
  } else {
    // Run K-means on the word vectors
    int clcn = classes, iter = 10, closeid;
    int *centcn = (int *)malloc(classes * sizeof(int));
    if (centcn == NULL) {
      fprintf(stderr, "cannot allocate memory for centcn\n");
      exit(1);
    }
    int *cl = (int *)calloc(vocab_size, sizeof(int));
    real closev, x;
    real *cent = (real *)calloc(classes * layer1_size, sizeof(real));
    for (a = 0; a < vocab_size; a++) cl[a] = a % clcn;
    for (a = 0; a < iter; a++) {
      for (b = 0; b < clcn * layer1_size; b++) cent[b] = 0;
      for (b = 0; b < clcn; b++) centcn[b] = 1;
      for (c = 0; c < vocab_size; c++) {
        for (d = 0; d < layer1_size; d++) cent[layer1_size * cl[c] + d] += syn0[c * layer1_size + d];
        centcn[cl[c]]++;
      }
      for (b = 0; b < clcn; b++) {
        closev = 0;
        for (c = 0; c < layer1_size; c++) {
          cent[layer1_size * b + c] /= centcn[b];
          closev += cent[layer1_size * b + c] * cent[layer1_size * b + c];
        }
        closev = sqrt(closev);
        for (c = 0; c < layer1_size; c++) cent[layer1_size * b + c] /= closev;
      }
      for (c = 0; c < vocab_size; c++) {
        closev = -10;
        closeid = 0;
        for (d = 0; d < clcn; d++) {
          x = 0;
          for (b = 0; b < layer1_size; b++) x += cent[layer1_size * d + b] * syn0[c * layer1_size + b];
          if (x > closev) {
            closev = x;
            closeid = d;
          }
        }
        cl[c] = closeid;
      }
    }
    // Save the K-means classes
    for (a = 0; a < vocab_size; a++) fprintf(fo, "%s %d\n", vocab[a].word, cl[a]);
    free(centcn);
    free(cent);
    free(cl);
  }
  fclose(fo);
  free(table);
  free(pt);
  DestroyVocab();
}